

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O2

int dh_derive(ptls_hpke_kem_t *kem,void *secret,ptls_iovec_t pk_s,ptls_iovec_t pk_r,ptls_iovec_t dh)

{
  size_t outlen;
  ptls_iovec_t info;
  int iVar1;
  ptls_iovec_t prk;
  ptls_buffer_t kem_context;
  uint8_t eae_prk [64];
  uint8_t kem_context_smallbuf [128];
  
  outlen = kem->hash->digest_size;
  kem_context.base = kem_context_smallbuf;
  kem_context.off = 0;
  kem_context.capacity = 0x80;
  kem_context.is_allocated = '\0';
  kem_context.align_bits = '\0';
  iVar1 = ptls_buffer__do_pushv(&kem_context,pk_s.base,pk_s.len);
  if (iVar1 == 0) {
    iVar1 = ptls_buffer__do_pushv(&kem_context,pk_r.base,pk_r.len);
    if (iVar1 == 0) {
      iVar1 = labeled_extract(kem,(ptls_hpke_cipher_suite_t *)0x0,eae_prk,
                              (ptls_iovec_t)ZEXT816(0x128c9d),"eae_prk",dh);
      if (iVar1 == 0) {
        info.len = kem_context.off;
        info.base = kem_context.base;
        prk.len = kem->hash->digest_size;
        prk.base = eae_prk;
        iVar1 = labeled_expand(kem,(ptls_hpke_cipher_suite_t *)0x0,secret,outlen,prk,"shared_secret"
                               ,info);
      }
    }
  }
  ptls_buffer_dispose(&kem_context);
  (*ptls_clear_memory)(eae_prk,0x40);
  return iVar1;
}

Assistant:

static int dh_derive(ptls_hpke_kem_t *kem, void *secret, ptls_iovec_t pk_s, ptls_iovec_t pk_r, ptls_iovec_t dh)
{
    return extract_and_expand(kem, secret, kem->hash->digest_size, pk_s, pk_r, dh);
}